

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::request_vote(raft_server *this,bool force_vote)

{
  atomic<int> *paVar1;
  __int_type_conflict _Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  long *plVar5;
  element_type *peVar6;
  __int_type _Var7;
  element_type *peVar8;
  element_type *this_00;
  element_type *peVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int32 iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  srv_role _role;
  msg_type type;
  undefined8 in_RDX;
  undefined7 in_register_00000031;
  __node_base *p_Var15;
  int local_d4;
  int32 *local_d0;
  undefined1 local_c8 [16];
  ptr<peer> pp;
  ptr<force_vote_msg> fv_msg;
  ptr<req_msg> req;
  ptr<log_entry> fv_msg_le;
  unsigned_long local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  rpc_handler *local_48;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_c8._8_4_ = (undefined4)CONCAT71(in_register_00000031,force_vote);
  LOCK();
  paVar1 = &((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->voted_for_;
  _Var2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = this->id_;
  UNLOCK();
  plVar5 = *(long **)&(((this->ctx_)._M_t.
                        super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                        .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->state_mgr_).
                      super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar5 + 0x20))
            (plVar5,(this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,in_RDX,_Var2);
  uVar3 = this->votes_responded_;
  uVar4 = this->votes_granted_;
  this->votes_responded_ = uVar3 + 1;
  this->votes_granted_ = uVar4 + 1;
  peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6 != (element_type *)0x0) {
    iVar11 = (*peVar6->_vptr_logger[7])();
    if (3 < iVar11) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_d0 = (int32 *)CONCAT44(local_d0._4_4_,this->id_);
      srv_role_to_string_abi_cxx11_((string *)&fv_msg_le,(nuraft *)(ulong)(this->role_)._M_i,_role);
      peVar9 = fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var7 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
      iVar11 = (*((this->log_store_).
                  super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_log_store[2])();
      iVar12 = (*((this->log_store_).
                  super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_log_store[2])();
      uVar14 = term_for_log(this,CONCAT44(extraout_var_00,iVar12) - 1);
      msg_if_given_abi_cxx11_
                ((string *)&fv_msg,
                 "[VOTE INIT] my id %d, my role %s, term %lu, log idx %lu, log term %lu, priority (target %d / mine %d)\n"
                 ,(ulong)local_d0 & 0xffffffff,peVar9,_Var7,CONCAT44(extraout_var,iVar11) + -1,
                 uVar14,(ulong)(uint)this->target_priority_,(ulong)(uint)this->my_priority_);
      (*peVar6->_vptr_logger[8])
                (peVar6,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"request_vote",0xe9,&fv_msg);
      std::__cxx11::string::~string((string *)&fv_msg);
      std::__cxx11::string::~string((string *)&fv_msg_le);
    }
  }
  iVar11 = this->votes_granted_;
  iVar13 = get_quorum_for_election(this);
  if (iVar13 < iVar11) {
    this->election_completed_ = true;
    become_leader(this);
  }
  else {
    local_d0 = &this->id_;
    p_Var15 = &(this->peers_)._M_h._M_before_begin;
    local_48 = &this->resp_handler_;
    while( true ) {
      p_Var15 = p_Var15->_M_nxt;
      if (p_Var15 == (__node_base *)0x0) break;
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var15 + 2));
      bVar10 = is_regular_member(this,(ptr<peer> *)
                                      &pp.
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
      ;
      if (bVar10) {
        fv_msg.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
        local_d4 = 1;
        local_c8._12_4_ =
             (((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_).
              super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
        iVar11 = (*((this->log_store_).
                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_log_store[2])();
        fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)term_for_log(this,CONCAT44(extraout_var_01,iVar11) - 1);
        iVar11 = (*((this->log_store_).
                    super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_log_store[2])();
        local_58 = CONCAT44(extraout_var_02,iVar11) - 1;
        local_c8._0_8_ = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
        std::
        make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long>
                  ((unsigned_long *)&req,(msg_type *)&fv_msg,&local_d4,local_d0,
                   (unsigned_long *)(local_c8 + 0xc),(unsigned_long *)&fv_msg_le,&local_58);
        if (local_c8[8] != '\0') {
          std::make_shared<nuraft::force_vote_msg>();
          local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
          force_vote_msg::serialize((force_vote_msg *)&local_58);
          local_d4 = CONCAT31(local_d4._1_3_,0xe7);
          std::
          make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                    ((int *)&fv_msg_le,(shared_ptr<nuraft::buffer> *)local_c8,
                     (log_val_type *)&local_58);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
          std::
          vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->log_entries_,&fv_msg_le);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&fv_msg.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar6 != (element_type *)0x0) {
          iVar11 = (*peVar6->_vptr_logger[7])();
          if (4 < iVar11) {
            peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_type_to_string_abi_cxx11_
                      ((string *)&fv_msg_le,
                       (nuraft *)
                       (ulong)((req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_msg_base).type_,type);
            msg_if_given_abi_cxx11_
                      ((string *)&fv_msg,"send %s to server %d with term %lu",
                       fv_msg_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,(ulong)(uint)((((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                               *)(p_Var15 + 2))->_M_ptr->config_).
                                            super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->id_,
                       (((this->state_).
                         super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       term_).super___atomic_base<unsigned_long>._M_i);
            (*peVar6->_vptr_logger[8])
                      (peVar6,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"request_vote",0x10e,(string *)&fv_msg);
            std::__cxx11::string::~string((string *)&fv_msg);
            std::__cxx11::string::~string((string *)&fv_msg_le);
          }
        }
        bVar10 = peer::make_busy(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
        this_00 = pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (bVar10) {
          std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_40,&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
          peer::send_req(this_00,(ptr<peer> *)&local_40,&req,local_48);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        }
        else {
          peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar6 != (element_type *)0x0) {
            iVar11 = (*peVar6->_vptr_logger[7])();
            if (2 < iVar11) {
              peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              peVar8 = ((pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)&fv_msg,"failed to send vote request: peer %d (%s) is busy",
                         (ulong)(uint)peVar8->id_,(peVar8->endpoint_)._M_dataplus._M_p);
              (*peVar6->_vptr_logger[8])
                        (peVar6,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"request_vote",0x113,(string *)&fv_msg);
              std::__cxx11::string::~string((string *)&fv_msg);
            }
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  return;
}

Assistant:

void raft_server::request_vote(bool force_vote) {
    state_->set_voted_for(id_);
    ctx_->state_mgr_->save_state(*state_);
    votes_granted_ += 1;
    votes_responded_ += 1;
    p_in("[VOTE INIT] my id %d, my role %s, term %" PRIu64 ", log idx %" PRIu64 ", "
         "log term %" PRIu64 ", priority (target %d / mine %d)\n",
         id_, srv_role_to_string(role_).c_str(),
         state_->get_term(), log_store_->next_slot() - 1,
         term_for_log(log_store_->next_slot() - 1),
         target_priority_, my_priority_);

    // is this the only server?
    if (votes_granted_ > get_quorum_for_election()) {
        election_completed_ = true;
        become_leader();
        return;
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) {
            // Do not send voting request to learner.
            continue;
        }
        ptr<req_msg> req = cs_new<req_msg>
                           ( state_->get_term(),
                             msg_type::request_vote_request,
                             id_,
                             pp->get_id(),
                             term_for_log(log_store_->next_slot() - 1),
                             log_store_->next_slot() - 1,
                             quick_commit_index_.load() );
        if (force_vote) {
            // Add a special log entry to let receivers ignore the priority.

            // Force vote message, and wrap it using log_entry.
            ptr<force_vote_msg> fv_msg = cs_new<force_vote_msg>();
            ptr<log_entry> fv_msg_le =
                cs_new<log_entry>(0, fv_msg->serialize(), log_val_type::custom);

            // Ship it.
            req->log_entries().push_back(fv_msg_le);
        }
        p_db( "send %s to server %d with term %" PRIu64 "",
              msg_type_to_string(req->get_type()).c_str(),
              it->second->get_id(),
              state_->get_term() );
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_wn("failed to send vote request: peer %d (%s) is busy",
                 pp->get_id(), pp->get_endpoint().c_str());
        }
    }
}